

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O3

void cmGccDepfile_yypop_buffer_state(yyscan_t yyscanner)

{
  YY_BUFFER_STATE_conflict b;
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  long lVar4;
  yyguts_t_conflict *yyg_1;
  yyguts_t_conflict *yyg;
  
  if ((*(long *)((long)yyscanner + 0x28) != 0) &&
     (b = *(YY_BUFFER_STATE_conflict *)
           (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8),
     b != (YY_BUFFER_STATE_conflict)0x0)) {
    cmGccDepfile_yy_delete_buffer(b,yyscanner);
    lVar4 = *(long *)((long)yyscanner + 0x18);
    *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + lVar4 * 8) = 0;
    if (lVar4 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 + -1;
      *(long *)((long)yyscanner + 0x18) = lVar4;
    }
    lVar1 = *(long *)((long)yyscanner + 0x28);
    if ((lVar1 != 0) && (lVar2 = *(long *)(lVar1 + lVar4 * 8), lVar2 != 0)) {
      *(undefined8 *)((long)yyscanner + 0x38) = *(undefined8 *)(lVar2 + 0x20);
      puVar3 = *(undefined1 **)(lVar2 + 0x10);
      *(undefined1 **)((long)yyscanner + 0x48) = puVar3;
      *(undefined1 **)((long)yyscanner + 0x88) = puVar3;
      *(undefined8 *)((long)yyscanner + 8) = **(undefined8 **)(lVar1 + lVar4 * 8);
      *(undefined1 *)((long)yyscanner + 0x30) = *puVar3;
      *(undefined4 *)((long)yyscanner + 0x58) = 1;
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER , yyscanner);
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if (yyg->yy_buffer_stack_top > 0)
		--yyg->yy_buffer_stack_top;

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state( yyscanner );
		yyg->yy_did_buffer_switch_on_eof = 1;
	}
}